

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_roll(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  OBJ_DATA *obj_00;
  char *in_RSI;
  long in_RDI;
  int sides;
  int number;
  int i;
  OBJ_DATA *obj;
  char buf2 [4608];
  char buf [4608];
  undefined4 in_stack_ffffffffffffdbb8;
  int in_stack_ffffffffffffdbbc;
  char *in_stack_ffffffffffffdbc0;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  undefined4 in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  int iVar4;
  int local_2424;
  char local_2418 [4576];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA local_1218 [5];
  long local_8;
  
  if (*in_RSI == '\0') {
    act((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
        in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
        (void *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),0);
    act((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
        in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
        (void *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),0);
  }
  else {
    local_8 = in_RDI;
    obj_00 = get_obj_carry(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,
                           in_stack_ffffffffffffedc8);
    if (obj_00 == (OBJ_DATA *)0x0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                   in_stack_ffffffffffffdbc8);
    }
    else if (obj_00->item_type == 7) {
      if (*(long *)(local_8 + 0x20) == 0) {
        bVar2 = is_ground(*(ROOM_INDEX_DATA **)(local_8 + 0xa8));
        if (bVar2) {
          iVar1 = obj_00->value[0];
          iVar4 = obj_00->value[1];
          if ((iVar1 < 1) || (iVar4 < 2)) {
            send_to_char((char *)CONCAT44(iVar4,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8
                        );
          }
          else {
            if (iVar1 < 2) {
              sprintf((char *)local_1218,"it");
            }
            else {
              sprintf((char *)local_1218,"them");
            }
            act((char *)CONCAT44(iVar4,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8,
                in_stack_ffffffffffffdbc0,
                (void *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),0);
            act((char *)CONCAT44(iVar4,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8,
                in_stack_ffffffffffffdbc0,
                (void *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),0);
            act((char *)CONCAT44(iVar4,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8,
                in_stack_ffffffffffffdbc0,
                (void *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),0);
            if (iVar1 == 1) {
              in_stack_ffffffffffffdbc8 = local_1218;
              uVar3 = number_range((int)in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbbc);
              sprintf((char *)in_stack_ffffffffffffdbc8,
                      "It rolls a brief distance before coming to a stop, showing a %d.",
                      (ulong)uVar3);
            }
            else {
              sprintf((char *)local_1218,"They clatter on the ground, coming to a stop showing: ");
              for (local_2424 = 0; local_2424 < iVar1; local_2424 = local_2424 + 1) {
                in_stack_ffffffffffffdbc0 = local_2418;
                uVar3 = number_range((int)in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbbc);
                sprintf(in_stack_ffffffffffffdbc0," %d",(ulong)uVar3);
                strcat((char *)local_1218,local_2418);
              }
              strcat((char *)local_1218,".");
            }
            act((char *)CONCAT44(iVar4,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8,
                in_stack_ffffffffffffdbc0,
                (void *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),0);
            obj_from_char(obj_00);
            obj_to_room(obj_00,*(ROOM_INDEX_DATA **)(local_8 + 0xa8));
          }
        }
        else {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                       in_stack_ffffffffffffdbc8);
        }
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                     in_stack_ffffffffffffdbc8);
      }
    }
    else {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                   in_stack_ffffffffffffdbc8);
    }
  }
  return;
}

Assistant:

void do_roll(CHAR_DATA *ch, char *argument)
{
	char buf[MSL], buf2[MSL];
	OBJ_DATA *obj;
	int i, number, sides;

	if (argument[0] == '\0')
	{
		act("You roll your eyes in disgust.", ch, 0, 0, TO_CHAR);
		act("$n rolls $s eyes, disgusted.", ch, 0, 0, TO_ROOM);
		return;
	}

	obj = get_obj_carry(ch, argument, ch);

	if (obj == nullptr)
	{
		send_to_char("Roll what?\n\r", ch);
		return;
	}

	if (obj->item_type != ITEM_DICE)
	{
		send_to_char("Those aren't dice!\n\r", ch);
		return;
	}

	if (ch->fighting)
	{
		send_to_char("You really have more important things to worry about right now!\n\r", ch);
		return;
	}

	if (!is_ground(ch->in_room))
	{
		send_to_char("You need a hard surface beneath you on which to roll.\n\r", ch);
		return;
	}

	number = obj->value[0];
	sides = obj->value[1];

	if (number <= 0 || sides <= 1)
	{
		send_to_char("Something's wrong with these dice, and they can't be rolled.\n\r", ch);
		return;
	}

	if (number > 1)
		sprintf(buf, "them");
	else
		sprintf(buf, "it");

	act("You cup your hands, rattle $p around, and roll $T.", ch, obj, buf, TO_CHAR);
	act("$n cups $s hands, rattles $p around, and rolls $T.", ch, obj, buf, TO_ROOM);

	act(".\n\r.\n\r.", ch, 0, 0, TO_ALL);

	if (number == 1)
	{
		sprintf(buf, "It rolls a brief distance before coming to a stop, showing a %d.", number_range(1, sides));
	}
	else
	{
		sprintf(buf, "They clatter on the ground, coming to a stop showing: ");

		for (i = 0; i < number; i++)
		{
			sprintf(buf2, " %d", number_range(1, sides));
			strcat(buf, buf2);
		}

		strcat(buf, ".");
	}

	act(buf, ch, 0, 0, TO_ALL);

	obj_from_char(obj);
	obj_to_room(obj, ch->in_room);
}